

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

void Assimp::IFC::ProcessSweptDiskSolid
               (IfcSweptDiskSolid *solid,TempMesh *result,ConversionData *conv)

{
  pointer *ppaVar1;
  uint uVar2;
  iterator iVar3;
  pointer paVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  IfcCurve *curve;
  Curve *pCVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  aiVector3t<double> *paVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  float fVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  undefined4 uVar36;
  float fVar37;
  double dVar38;
  undefined4 uVar39;
  float fVar40;
  undefined4 uVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  char *unaff_retaddr;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> points;
  TempMesh temp;
  long local_1f0;
  aiVector3t<double> local_1c8;
  double local_1a8;
  undefined8 uStack_1a0;
  long local_190;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_188;
  undefined1 local_168 [16];
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_110;
  double *local_108;
  double *pdStack_100;
  long local_f8;
  void *pvStack_f0;
  undefined8 local_e8;
  long lStack_e0;
  long local_d8;
  IfcSweptDiskSolid *local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                    (*(LazyObject **)&(solid->super_IfcSolidModel).field_0x40);
  pCVar13 = Curve::Convert(curve,conv);
  if (pCVar13 == (Curve *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  uVar2 = conv->settings->cylindricalTessellation;
  uVar22 = (ulong)uVar2;
  local_e8 = 0;
  lStack_e0 = 0;
  local_f8 = 0;
  pvStack_f0 = (void *)0x0;
  local_108 = (double *)0x0;
  pdStack_100 = (double *)0x0;
  local_d0 = solid;
  (*pCVar13->_vptr_Curve[7])(SUB84(solid->StartParam,0),SUB84(solid->EndParam,0),pCVar13);
  pdVar10 = pdStack_100;
  pdVar17 = local_108;
  lVar23 = ((long)pdStack_100 - (long)local_108 >> 3) * -0x5555555555555555;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,lVar23 * uVar22 * 4);
  local_b0 = &result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_b0,(ulong)(uVar2 - 1) * lVar23);
  local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
  local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&local_188,lVar23 * uVar22);
  if (local_108 == pdStack_100) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5a338a);
  }
  else {
    local_190 = lVar23;
    if (pdVar10 != pdVar17) {
      local_110 = 6.283185307179586 / (double)uVar22;
      dVar42 = local_108[2];
      dVar47 = *local_108;
      dVar45 = local_108[1];
      local_d8 = lVar23 + -1;
      iVar12 = 0;
      lVar24 = 0;
      uVar25 = SUB84(dVar42,0);
      uVar26 = (undefined4)((ulong)dVar42 >> 0x20);
      uVar29 = SUB84(dVar45,0);
      uVar27 = (undefined4)((ulong)dVar45 >> 0x20);
      uVar33 = SUB84(dVar47,0);
      uVar28 = (undefined4)((ulong)dVar47 >> 0x20);
      uVar30 = 0;
      uVar32 = 0;
      uVar34 = 0;
      uVar36 = 0;
      local_b8 = 0.0;
      local_148 = ZEXT816(0x3ff0000000000000);
      local_138 = ZEXT816(0x3ff0000000000000);
      local_128 = ZEXT816(0x3ff0000000000000);
      do {
        uVar39 = SUB84(local_b8,0);
        uVar41 = (undefined4)((ulong)local_b8 >> 0x20);
        local_c0 = (double)CONCAT44(uVar36,uVar34);
        local_c8 = (double)CONCAT44(uVar32,uVar30);
        if (lVar24 != local_d8) {
          local_c8 = local_108[lVar24 * 3 + 3];
          local_c0 = local_108[lVar24 * 3 + 4];
          uVar39 = SUB84(local_108[lVar24 * 3 + 5],0);
          uVar41 = (undefined4)((ulong)local_108[lVar24 * 3 + 5] >> 0x20);
        }
        uStack_1a0 = 0;
        uVar32 = 0;
        uVar30 = 0;
        local_1a8 = (local_c8 - (double)CONCAT44(uVar28,uVar33)) +
                    (dVar47 - (double)CONCAT44(uVar28,uVar33));
        dVar7 = (local_c0 - (double)CONCAT44(uVar27,uVar29)) +
                (dVar45 - (double)CONCAT44(uVar27,uVar29));
        local_168._0_8_ =
             ((double)CONCAT44(uVar41,uVar39) - (double)CONCAT44(uVar26,uVar25)) +
             (dVar42 - (double)CONCAT44(uVar26,uVar25));
        dVar5 = (double)local_168._0_8_ * (double)local_168._0_8_ +
                local_1a8 * local_1a8 + dVar7 * dVar7;
        local_b8 = (double)CONCAT44(uVar41,uVar39);
        local_150 = dVar42;
        if (dVar5 < 0.0) {
          uStack_1a0 = 0;
          local_168._8_8_ = 0;
          dVar5 = sqrt(dVar5);
          uVar30 = local_168._8_4_;
          uVar32 = local_168._12_4_;
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar5 = 1.0 / dVar5;
        local_1a8 = local_1a8 * dVar5;
        dVar7 = dVar7 * dVar5;
        local_168._0_8_ = (double)local_168._0_8_ * dVar5;
        iVar11 = 1;
        bVar9 = false;
        do {
          uVar26 = local_128._8_4_;
          uVar29 = local_128._12_4_;
          dVar5 = local_128._0_8_;
          uVar25 = local_138._8_4_;
          uVar21 = local_138._12_4_;
          dVar42 = local_138._0_8_;
          if ((!(bool)(iVar12 != 0 & (bVar9 ^ 1U))) && (1e-06 < ABS(local_1a8))) {
            uVar33 = 0x80000000;
            uVar27 = 0;
            dVar6 = -(dVar7 * dVar42 + dVar5 * (double)local_168._0_8_) / local_1a8;
            iVar12 = 0;
            goto LAB_005a2c1d;
          }
          uVar27 = local_148._8_4_;
          uVar33 = local_148._12_4_;
          dVar6 = local_148._0_8_;
          if ((!(bool)(iVar12 != 1 & (bVar9 ^ 1U))) && (1e-06 < ABS(dVar7))) {
            uVar21 = (uint)((ulong)uStack_1a0 >> 0x20) ^ 0x80000000;
            uVar25 = (undefined4)uStack_1a0;
            dVar42 = -(local_1a8 * dVar6 + dVar5 * (double)local_168._0_8_) / dVar7;
            iVar12 = 1;
            goto LAB_005a2c1d;
          }
          if (iVar12 == 2) {
            if (1e-06 < ABS((double)local_168._0_8_) || bVar9) {
LAB_005a2be2:
              uVar29 = 0x80000000;
              uVar26 = 0;
              dVar5 = -(dVar7 * dVar42 + dVar6 * local_1a8) / (double)local_168._0_8_;
              iVar12 = 2;
              goto LAB_005a2c1d;
            }
          }
          else if (bVar9) goto LAB_005a2be2;
          bVar9 = true;
          iVar11 = iVar11 + -1;
        } while (iVar11 == 0);
        dVar5 = 0.0;
        uVar26 = 0;
        uVar29 = 0;
        dVar42 = 0.0;
        uVar25 = 0;
        uVar21 = 0;
        dVar6 = 0.0;
        uVar27 = 0;
        uVar33 = 0;
LAB_005a2c1d:
        dVar38 = local_d0->Radius;
        local_138._8_4_ = uVar25;
        local_138._0_8_ = dVar42;
        local_138._12_4_ = uVar21;
        local_148._8_4_ = uVar27;
        local_148._0_8_ = dVar6;
        local_148._12_4_ = uVar33;
        local_128._8_4_ = uVar26;
        local_128._0_8_ = dVar5;
        local_128._12_4_ = uVar29;
        dVar42 = dVar5 * dVar5 + dVar6 * dVar6 + dVar42 * dVar42;
        local_168._8_4_ = uVar30;
        local_168._12_4_ = uVar32;
        if (dVar42 < 0.0) {
          dVar42 = sqrt(dVar42);
        }
        else {
          dVar42 = SQRT(dVar42);
        }
        dVar38 = dVar38 / dVar42;
        local_158 = cos(local_110);
        dVar42 = ::sin(local_110);
        uVar25 = local_148._12_4_;
        dVar5 = local_148._0_8_ * dVar38;
        local_148._8_4_ = local_148._8_4_;
        local_148._0_8_ = dVar5;
        local_148._12_4_ = uVar25;
        uVar25 = local_138._12_4_;
        dVar6 = local_138._0_8_ * dVar38;
        local_138._8_4_ = local_138._8_4_;
        local_138._0_8_ = dVar6;
        local_138._12_4_ = uVar25;
        uVar25 = local_128._12_4_;
        dVar38 = local_128._0_8_ * dVar38;
        local_128._8_4_ = local_128._8_4_;
        local_128._0_8_ = dVar38;
        local_128._12_4_ = uVar25;
        if (uVar2 != 0) {
          dVar8 = 1.0 - local_158;
          dVar43 = local_1a8 * dVar8;
          uVar25 = (undefined4)uStack_1a0;
          uVar26 = (undefined4)((ulong)uStack_1a0 >> 0x20);
          local_58._8_4_ = uVar25;
          local_58._0_8_ = dVar43 * local_1a8 + local_158;
          local_58._12_4_ = uVar26;
          local_78._8_4_ = uVar25;
          local_78._0_8_ = dVar43 * dVar7 - (double)local_168._0_8_ * dVar42;
          local_78._12_4_ = uVar26;
          local_68 = dVar43 * dVar7 + (double)local_168._0_8_ * dVar42;
          uStack_60 = uStack_1a0;
          local_88._8_4_ = uVar25;
          local_88._0_8_ = dVar43 * (double)local_168._0_8_ + dVar7 * dVar42;
          local_88._12_4_ = uVar26;
          dVar46 = dVar7 * dVar7 * dVar8 + local_158;
          dVar44 = dVar7 * dVar8 * (double)local_168._0_8_;
          local_48 = dVar43 * (double)local_168._0_8_ - dVar7 * dVar42;
          uStack_40 = uStack_1a0;
          local_a8._8_8_ = 0;
          local_a8._0_8_ = dVar44 - local_1a8 * dVar42;
          local_98._8_8_ = 0;
          local_98._0_8_ = dVar44 + local_1a8 * dVar42;
          local_158 = dVar8 * (double)local_168._0_8_ * (double)local_168._0_8_ + local_158;
          uVar15 = uVar22;
          do {
            local_1c8.x = dVar47 + dVar5;
            local_168._0_8_ = dVar6;
            local_1c8.y = dVar45 + dVar6;
            local_1c8.z = local_150 + dVar38;
            local_1a8 = dVar5;
            if (local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_188.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_188
                         ,(iterator)
                          local_188.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_1c8);
            }
            else {
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_1c8.z;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = local_1c8.x;
              (local_188.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = local_1c8.y;
              local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_188.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dVar5 = (double)local_88._0_8_ * dVar38 +
                    (double)local_58._0_8_ * local_1a8 +
                    (double)local_78._0_8_ * (double)local_168._0_8_ + 0.0;
            dVar6 = (double)local_a8._0_8_ * dVar38 +
                    local_68 * local_1a8 + dVar46 * (double)local_168._0_8_ + 0.0;
            dVar38 = dVar38 * local_158 +
                     local_1a8 * local_48 + (double)local_168._0_8_ * (double)local_98._0_8_ + 0.0;
            uVar21 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar21;
          } while (uVar21 != 0);
        }
        lVar24 = lVar24 + 1;
        uVar25 = SUB84(local_150,0);
        uVar26 = (undefined4)((ulong)local_150 >> 0x20);
        uVar29 = SUB84(dVar45,0);
        uVar27 = (undefined4)((ulong)dVar45 >> 0x20);
        uVar33 = SUB84(dVar47,0);
        uVar28 = (undefined4)((ulong)dVar47 >> 0x20);
        uVar30 = SUB84(local_c8,0);
        uVar32 = (undefined4)((ulong)local_c8 >> 0x20);
        uVar34 = SUB84(local_c0,0);
        uVar36 = (undefined4)((ulong)local_c0 >> 0x20);
        dVar42 = local_b8;
        dVar45 = local_c0;
        dVar47 = local_c8;
      } while (lVar24 != lVar23 + (ulong)(lVar23 == 0));
    }
    if (local_190 + -1 != 0) {
      lVar24 = uVar22 * 0x18 + 0x10;
      local_168._0_8_ = uVar22 - 1;
      local_1f0 = 0;
      lVar23 = 0;
      local_190 = local_190 + -1;
      do {
        lVar14 = lVar23 * uVar22;
        local_1a8 = (double)(lVar14 * 3);
        iVar12 = 0;
        if (uVar2 != 0) {
          pdVar17 = (double *)
                    ((long)&(local_188.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar24);
          uVar19 = 0;
          uVar15 = 0;
          fVar31 = 1e+10;
          do {
            fVar35 = (float)pdVar17[-2] -
                     (float)local_188.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar14].x;
            fVar37 = (float)pdVar17[-1] -
                     (float)local_188.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar14].y;
            fVar40 = (float)*pdVar17 -
                     (float)local_188.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar14].z;
            fVar35 = fVar40 * fVar40 + fVar35 * fVar35 + fVar37 * fVar37;
            if (fVar35 < fVar31) {
              uVar15 = uVar19 & 0xffffffff;
              fVar31 = fVar35;
            }
            iVar12 = (int)uVar15;
            uVar19 = uVar19 + 1;
            pdVar17 = pdVar17 + 3;
          } while (uVar22 != uVar19);
        }
        if (uVar2 != 0) {
          lVar18 = (lVar23 + 1) * uVar22;
          local_1a8 = (double)(lVar14 * 0x18);
          uVar15 = 0;
          lVar14 = local_1f0;
          do {
            paVar20 = (aiVector3t<double> *)
                      ((long)&(local_188.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->x + lVar14);
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,paVar20);
            }
            else {
              (iVar3._M_current)->z = paVar20->z;
              dVar42 = paVar20->y;
              (iVar3._M_current)->x = paVar20->x;
              (iVar3._M_current)->y = dVar42;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar19 = uVar15 + 1;
            uVar16 = 0;
            if (local_168._0_8_ != uVar15) {
              uVar16 = uVar19;
            }
            paVar20 = (aiVector3t<double> *)
                      ((long)&local_188.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].x + (long)local_1a8)
            ;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,paVar20);
            }
            else {
              (iVar3._M_current)->z = paVar20->z;
              dVar42 = paVar20->y;
              (iVar3._M_current)->x = paVar20->x;
              (iVar3._M_current)->y = dVar42;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            paVar20 = local_188.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      lVar18 + (ulong)((int)uVar15 + iVar12 + 1) % uVar22;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,paVar20);
            }
            else {
              (iVar3._M_current)->z = paVar20->z;
              dVar42 = paVar20->y;
              (iVar3._M_current)->x = paVar20->x;
              (iVar3._M_current)->y = dVar42;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            paVar20 = local_188.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      lVar18 + (ulong)(uint)((int)uVar15 + iVar12) % uVar22;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,paVar20);
            }
            else {
              (iVar3._M_current)->z = paVar20->z;
              dVar42 = paVar20->y;
              (iVar3._M_current)->x = paVar20->x;
              (iVar3._M_current)->y = dVar42;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            paVar4 = (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            dVar42 = paVar4[-4].x;
            dVar38 = dVar42 - paVar4[-3].x;
            dVar47 = paVar4[-4].y;
            dVar44 = dVar47 - paVar4[-3].y;
            dVar45 = paVar4[-4].z;
            dVar7 = dVar45 - paVar4[-3].z;
            dVar6 = dVar42 - paVar4[-1].x;
            dVar5 = dVar47 - paVar4[-1].y;
            dVar46 = dVar45 - paVar4[-1].z;
            if ((dVar45 - local_108[lVar23 * 3 + 2]) * (dVar5 * dVar38 - dVar6 * dVar44) +
                (dVar47 - local_108[lVar23 * 3 + 1]) * (dVar7 * dVar6 - dVar46 * dVar38) +
                (dVar42 - local_108[lVar23 * 3]) * (dVar44 * dVar46 - dVar5 * dVar7) < 0.0) {
              dVar42 = paVar4[-4].z;
              dVar47 = paVar4[-4].x;
              dVar45 = paVar4[-4].y;
              paVar4[-4].z = paVar4[-1].z;
              dVar5 = paVar4[-1].y;
              paVar4[-4].x = paVar4[-1].x;
              paVar4[-4].y = dVar5;
              paVar4[-1].z = dVar42;
              paVar4[-1].x = dVar47;
              paVar4[-1].y = dVar45;
              local_1c8.z = paVar4[-3].z;
              local_1c8.x = paVar4[-3].x;
              local_1c8.y = paVar4[-3].y;
              paVar4[-3].z = paVar4[-2].z;
              dVar42 = paVar4[-2].y;
              paVar4[-3].x = paVar4[-2].x;
              paVar4[-3].y = dVar42;
              paVar4[-2].z = local_1c8.z;
              paVar4[-2].x = local_1c8.x;
              paVar4[-2].y = local_1c8.y;
            }
            local_1c8.x = (double)CONCAT44(local_1c8.x._4_4_,4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (local_b0,(uint *)&local_1c8);
            lVar14 = lVar14 + 0x18;
            uVar15 = uVar19;
          } while (uVar22 != uVar19);
        }
        lVar23 = lVar23 + 1;
        lVar24 = lVar24 + uVar22 * 0x18;
        local_1f0 = local_1f0 + uVar22 * 0x18;
      } while (lVar23 != local_190);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5a335f);
  }
  if (local_188.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  if (local_108 != (double *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return;
}

Assistant:

void ProcessSweptDiskSolid(const Schema_2x3::IfcSweptDiskSolid &solid, TempMesh& result, ConversionData& conv)
{
    const Curve* const curve = Curve::Convert(*solid.Directrix, conv);
    if(!curve) {
        IFCImporter::LogError("failed to convert Directrix curve (IfcSweptDiskSolid)");
        return;
    }

    const unsigned int cnt_segments = conv.settings.cylindricalTessellation;
    const IfcFloat deltaAngle = AI_MATH_TWO_PI/cnt_segments;

	TempMesh temp;
	curve->SampleDiscrete(temp, solid.StartParam, solid.EndParam);
	const std::vector<IfcVector3>& curve_points = temp.mVerts;

    const size_t samples = curve_points.size();

    result.mVerts.reserve(cnt_segments * samples * 4);
    result.mVertcnt.reserve((cnt_segments - 1) * samples);

    std::vector<IfcVector3> points;
    points.reserve(cnt_segments * samples);

    if(curve_points.empty()) {
        IFCImporter::LogWarn("curve evaluation yielded no points (IfcSweptDiskSolid)");
        return;
    }

    IfcVector3 current = curve_points[0];
    IfcVector3 previous = current;
    IfcVector3 next;

    IfcVector3 startvec;
    startvec.x = 1.0f;
    startvec.y = 1.0f;
    startvec.z = 1.0f;

    unsigned int last_dir = 0;

    // generate circles at the sweep positions
    for(size_t i = 0; i < samples; ++i) {

        if(i != samples - 1) {
            next = curve_points[i + 1];
        }

        // get a direction vector reflecting the approximate curvature (i.e. tangent)
        IfcVector3 d = (current-previous) + (next-previous);

        d.Normalize();

        // figure out an arbitrary point q so that (p-q) * d = 0,
        // try to maximize ||(p-q)|| * ||(p_last-q_last)||
        IfcVector3 q;
        bool take_any = false;

        for (unsigned int i = 0; i < 2; ++i, take_any = true) {
            if ((last_dir == 0 || take_any) && std::abs(d.x) > 1e-6) {
                q.y = startvec.y;
                q.z = startvec.z;
                q.x = -(d.y * q.y + d.z * q.z) / d.x;
                last_dir = 0;
                break;
            }
            else if ((last_dir == 1 || take_any) && std::abs(d.y) > 1e-6) {
                q.x = startvec.x;
                q.z = startvec.z;
                q.y = -(d.x * q.x + d.z * q.z) / d.y;
                last_dir = 1;
                break;
            }
            else if ((last_dir == 2 && std::abs(d.z) > 1e-6) || take_any) {
                q.y = startvec.y;
                q.x = startvec.x;
                q.z = -(d.y * q.y + d.x * q.x) / d.z;
                last_dir = 2;
                break;
            }
        }

        q *= solid.Radius / q.Length();
        startvec = q;

        // generate a rotation matrix to rotate q around d
        IfcMatrix4 rot;
        IfcMatrix4::Rotation(deltaAngle,d,rot);

        for (unsigned int seg = 0; seg < cnt_segments; ++seg, q *= rot ) {
            points.push_back(q + current);
        }

        previous = current;
        current = next;
    }

    // make quads
    for(size_t i = 0; i < samples - 1; ++i) {

        const aiVector3D& this_start = points[ i * cnt_segments ];

        // locate corresponding point on next sample ring
        unsigned int best_pair_offset = 0;
        float best_distance_squared = 1e10f;
        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {
            const aiVector3D& p = points[ (i+1) * cnt_segments + seg];
            const float l = (p-this_start).SquareLength();

            if(l < best_distance_squared) {
                best_pair_offset = seg;
                best_distance_squared = l;
            }
        }

        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {

            result.mVerts.push_back(points[ i * cnt_segments + (seg % cnt_segments)]);
            result.mVerts.push_back(points[ i * cnt_segments + (seg + 1) % cnt_segments]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + 1 + best_pair_offset) % cnt_segments)]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + best_pair_offset) % cnt_segments)]);

            IfcVector3& v1 = *(result.mVerts.end()-1);
            IfcVector3& v2 = *(result.mVerts.end()-2);
            IfcVector3& v3 = *(result.mVerts.end()-3);
            IfcVector3& v4 = *(result.mVerts.end()-4);

            if (((v4-v3) ^ (v4-v1)) * (v4 - curve_points[i]) < 0.0f) {
                std::swap(v4, v1);
                std::swap(v3, v2);
            }

            result.mVertcnt.push_back(4);
        }
    }

    IFCImporter::LogDebug("generate mesh procedurally by sweeping a disk along a curve (IfcSweptDiskSolid)");
}